

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

Index __thiscall
wasm::WasmBinaryReader::readMemoryAccess(WasmBinaryReader *this,Address *alignment,Address *offset)

{
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  reference this_00;
  ulong uVar4;
  uint64_t local_c8;
  BasicType local_9c;
  pointer local_98;
  Memory *memory;
  string local_88;
  allocator<char> local_51;
  string local_50;
  uint local_2c;
  byte local_25;
  Index memIdx;
  bool hasMemIdx;
  Address *pAStack_20;
  uint32_t rawAlignment;
  Address *offset_local;
  Address *alignment_local;
  WasmBinaryReader *this_local;
  
  pAStack_20 = offset;
  offset_local = alignment;
  alignment_local = (Address *)this;
  memIdx = getU32LEB(this);
  local_2c = 0;
  local_25 = (memIdx & 0x40) != 0;
  if ((bool)local_25) {
    memIdx = memIdx & 0xffffffbf;
  }
  if (8 < memIdx) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Alignment must be of a reasonable size",&local_51);
    throwError(this,&local_50);
  }
  uVar2 = Bits::pow2(memIdx);
  wasm::Address::operator=(offset_local,(ulong)uVar2);
  if ((local_25 & 1) != 0) {
    local_2c = getU32LEB(this);
  }
  uVar4 = (ulong)local_2c;
  sVar3 = std::
          vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ::size(&this->wasm->memories);
  if (sVar3 <= uVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Memory index out of range while reading memory alignment.",
               (allocator<char> *)((long)&memory + 7));
    throwError(this,&local_88);
  }
  this_00 = std::
            vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ::operator[](&this->wasm->memories,(ulong)local_2c);
  local_98 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::get(this_00);
  local_9c = i32;
  bVar1 = wasm::Type::operator==(&local_98->addressType,&local_9c);
  if (bVar1) {
    uVar2 = getU32LEB(this);
    local_c8 = (uint64_t)uVar2;
  }
  else {
    local_c8 = getU64LEB(this);
  }
  wasm::Address::operator=(pAStack_20,local_c8);
  return local_2c;
}

Assistant:

Index WasmBinaryReader::readMemoryAccess(Address& alignment, Address& offset) {
  auto rawAlignment = getU32LEB();
  bool hasMemIdx = false;
  Index memIdx = 0;
  // Check bit 6 in the alignment to know whether a memory index is present per:
  // https://github.com/WebAssembly/multi-memory/blob/main/proposals/multi-memory/Overview.md
  if (rawAlignment & (1 << (6))) {
    hasMemIdx = true;
    // Clear the bit before we parse alignment
    rawAlignment = rawAlignment & ~(1 << 6);
  }

  if (rawAlignment > 8) {
    throwError("Alignment must be of a reasonable size");
  }

  alignment = Bits::pow2(rawAlignment);
  if (hasMemIdx) {
    memIdx = getU32LEB();
  }
  if (memIdx >= wasm.memories.size()) {
    throwError("Memory index out of range while reading memory alignment.");
  }
  auto* memory = wasm.memories[memIdx].get();
  offset = memory->addressType == Type::i32 ? getU32LEB() : getU64LEB();

  return memIdx;
}